

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<std::complex<double>,double,(char)78>(void)

{
  double *pdVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ostream *poVar8;
  long lVar9;
  quaternion<double> *x;
  pointer pqVar10;
  pointer pqVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  result_type_conflict1 in_XMM0_Qa;
  result_type_conflict1 rVar14;
  result_type_conflict1 rVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  result_type_conflict1 in_XMM1_Qa;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  complex<double> ALPHA_00;
  quaternion<double> *Y_00;
  int32_t in_stack_fffffffffffffca8;
  complex<double> ALPHA;
  quaternion<double> local_310;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_288 [8];
  undefined8 local_280;
  shared_count sStack_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_218;
  undefined1 local_210;
  undefined8 *local_208;
  char **local_200;
  quaternion<double> __r;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar11 = X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pqVar10 = Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pqVar11 !=
      X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar11 = pqVar11 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar15 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar11->_M_real = in_XMM1_Qa;
    pqVar11->_M_imag_i = rVar14;
    pqVar11->_M_imag_j = rVar15;
    pqVar11->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar11 = A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      pqVar10 !=
      Y.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar10 = pqVar10 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar15 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar10->_M_real = in_XMM1_Qa;
    pqVar10->_M_imag_i = rVar14;
    pqVar10->_M_imag_j = rVar15;
    pqVar10->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar11 !=
         A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish; pqVar11 = pqVar11 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar15 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar11->_M_real = in_XMM1_Qa;
    pqVar11->_M_imag_i = rVar14;
    pqVar11->_M_imag_j = rVar15;
    pqVar11->_M_imag_k = in_XMM0_Qa;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  genRandom<std::complex<double>>();
  ALPHA._M_value._0_8_ = in_XMM0_Qa;
  ALPHA._M_value._8_8_ = in_XMM1_Qa;
  dVar16 = genRandom<double>();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar8 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar8,'N');
  std::operator<<(local_1a8,"C");
  std::operator<<(local_1a8,"R");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_310);
  poVar8 = std::operator<<(poVar8," will use");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::string::~string((string *)&local_310);
  poVar8 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar8 = std::operator<<(poVar8,(complex *)&ALPHA);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar8 = std::ostream::_M_insert<double>(dVar16);
  Y_00 = (quaternion<double> *)0x14f901;
  std::endl<char,std::char_traits<char>>(poVar8);
  ALPHA_00._M_value._8_8_ = 100;
  ALPHA_00._M_value._0_8_ =
       A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
            ('N',100,100,ALPHA_00,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,
             Y.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,(double)ALPHA._M_value._0_8_,Y_00,
             in_stack_fffffffffffffca8);
  for (lVar9 = 0; lVar9 != 0xc80; lVar9 = lVar9 + 0x20) {
    HAXX::HBLAS_DOTUV<double>
              (&local_310,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar9),100,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    dVar7 = local_310._M_imag_k;
    dVar6 = local_310._M_imag_j;
    dVar5 = local_310._M_imag_i;
    dVar4 = local_310._M_real;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_238 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x47,&local_250);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = ALPHA._M_value._8_8_;
    auVar3._8_8_ = dVar5;
    auVar3._0_8_ = dVar4;
    auVar3._16_8_ = dVar6;
    auVar3._24_8_ = dVar7;
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar17,auVar12);
    auVar12 = vunpcklpd_avx(auVar12,auVar17);
    auVar13 = vshufpd_avx(auVar3,auVar3,5);
    auVar2 = vpermpd_avx2(ZEXT1632(auVar12),0x44);
    auVar19._0_8_ = auVar13._0_8_ * auVar2._0_8_;
    auVar19._8_8_ = auVar13._8_8_ * auVar2._8_8_;
    auVar19._16_8_ = auVar13._16_8_ * auVar2._16_8_;
    auVar19._24_8_ = auVar13._24_8_ * auVar2._24_8_;
    auVar13._8_8_ = ALPHA._M_value._0_8_;
    auVar13._0_8_ = ALPHA._M_value._0_8_;
    auVar13._16_8_ = ALPHA._M_value._0_8_;
    auVar13._24_8_ = ALPHA._M_value._0_8_;
    auVar13 = vfmadd231pd_avx512vl(auVar19,auVar3,auVar13);
    pdVar1 = (double *)
             ((long)&(YC.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar9);
    __r._M_real = auVar13._0_8_ + dVar16 * *pdVar1;
    __r._M_imag_i = auVar13._8_8_ + dVar16 * pdVar1[1];
    __r._M_imag_j = auVar13._16_8_ + dVar16 * pdVar1[2];
    __r._M_imag_k = auVar13._24_8_ + dVar16 * pdVar1[3];
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar9));
    HAXX::operator*(&local_310,&__r,&local_1d8);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_310._M_imag_i;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_310._M_imag_j;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_310._M_imag_k;
    local_210 = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (local_310._M_real + -1.0) * (local_310._M_real + -1.0);
    auVar12 = vfmadd231sd_fma(auVar22,auVar18,auVar18);
    auVar12 = vfmadd231sd_fma(auVar12,auVar20,auVar20);
    auVar12 = vfmadd231sd_fma(auVar12,auVar21,auVar21);
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    local_288[0] = auVar12._0_8_ < 1e-12;
    local_280 = 0;
    sStack_278.pi_ = (sp_counted_base *)0x0;
    local_260 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_258 = "";
    local_218 = &PTR__lazy_ostream_00219908;
    local_208 = &boost::unit_test::lazy_ostream::inst;
    local_200 = &local_260;
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_268 = "";
    boost::test_tools::tt_detail::report_assertion(local_288,&local_218,&local_270,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_278);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}